

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O3

void __thiscall
cnn::LookupParameters::load<boost::archive::text_iarchive>
          (LookupParameters *this,text_iarchive *ar,uint param_2)

{
  pointer pTVar1;
  long lVar2;
  pointer pTVar3;
  ulong uVar4;
  ulong uVar5;
  void *x;
  bool bVar6;
  int nv;
  int local_2c;
  
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Dim>_>::
  get_instance();
  boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)&this->dim);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_2c);
  pTVar1 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_2c == (int)((ulong)((long)pTVar1 - (long)pTVar3) >> 3) * 0x38e38e39) {
    if (pTVar1 != pTVar3) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Tensor>_>
        ::get_instance();
        boost::archive::detail::basic_iarchive::load_object
                  (ar,(basic_iserializer *)(pTVar3 + uVar4));
        pTVar3 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar4 = ((long)(this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3) *
                -0x71c71c71c71c71c7;
        bVar6 = uVar5 <= uVar4;
        lVar2 = uVar4 - uVar5;
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar6 && lVar2 != 0);
    }
    return;
  }
  __assert_fail("nv == (int)values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                ,0x5c,
                "void cnn::LookupParameters::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & dim;
    int nv;
    ar & nv;
    assert(nv == (int)values.size());
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }